

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Dialog::on_mouse_button_up(Dialog *this,ALLEGRO_MOUSE_EVENT *event)

{
  ulong uVar1;
  long in_RSI;
  long in_RDI;
  
  if ((*(int *)(in_RSI + 0x40) == 1) && (*(long *)(in_RDI + 0x50) != 0)) {
    (**(code **)(**(long **)(in_RDI + 0x50) + 0x40))
              (*(long **)(in_RDI + 0x50),*(undefined4 *)(in_RSI + 0x20),
               *(undefined4 *)(in_RSI + 0x24));
    uVar1 = (**(code **)(**(long **)(in_RDI + 0x50) + 0x10))
                      (*(long **)(in_RDI + 0x50),*(undefined4 *)(in_RSI + 0x20),
                       *(undefined4 *)(in_RSI + 0x24));
    if ((uVar1 & 1) != 0) {
      (**(code **)(**(long **)(in_RDI + 0x50) + 0x48))
                (*(long **)(in_RDI + 0x50),*(undefined4 *)(in_RSI + 0x20),
                 *(undefined4 *)(in_RSI + 0x24));
    }
    *(undefined8 *)(in_RDI + 0x50) = 0;
  }
  return;
}

Assistant:

void Dialog::on_mouse_button_up(const ALLEGRO_MOUSE_EVENT & event)
{
   if (event.button != 1)
      return;
   if (!this->mouse_down_widget)
      return;

   this->mouse_down_widget->on_mouse_button_up(event.x, event.y);
   if (this->mouse_down_widget->contains(event.x, event.y)) {
      this->mouse_down_widget->on_click(event.x, event.y);
   }
   this->mouse_down_widget = NULL;
}